

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_motion.cxx
# Opt level: O0

void __thiscall xray_re::xr_motion::~xr_motion(xr_motion *this)

{
  xr_motion *this_local;
  
  this->_vptr_xr_motion = (_func_int **)&PTR__xr_motion_00391148;
  std::__cxx11::string::~string((string *)&this->m_name);
  return;
}

Assistant:

xr_motion::~xr_motion() {}